

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::DistExpression::DistItem>::
emplaceRealloc<slang::ast::DistExpression::DistItem&>
          (SmallVectorBase<slang::ast::DistExpression::DistItem> *this,pointer pos,DistItem *args)

{
  size_type sVar1;
  undefined7 uVar2;
  size_type sVar3;
  size_type capacity;
  iterator pDVar4;
  DistItem *__result;
  DistItem *pDVar5;
  iterator __first;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  DistItem *args_local;
  pointer pos_local;
  SmallVectorBase<slang::ast::DistExpression::DistItem> *this_local;
  
  sVar1 = this->len;
  sVar3 = max_size(this);
  if (sVar1 == sVar3) {
    slang::detail::throwLengthError();
  }
  capacity = calculateGrowth(this,this->len + 1);
  pDVar4 = begin(this);
  __result = (DistItem *)slang::detail::allocArray(capacity,0x20);
  pDVar5 = __result + ((long)pos - (long)pDVar4 >> 5);
  pDVar5->value = args->value;
  *(undefined8 *)
   &(pDVar5->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
    _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload =
       *(undefined8 *)
        &(args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
         _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload;
  (pDVar5->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
  _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
  _M_value.expr =
       (args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
       _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
       _M_value.expr;
  uVar2 = *(undefined7 *)
           &(args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            field_0x11;
  (pDVar5->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
  _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
       (args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
       _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged;
  *(undefined7 *)
   &(pDVar5->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
    _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11 =
       uVar2;
  pDVar4 = end(this);
  if (pos == pDVar4) {
    __first = begin(this);
    pDVar4 = end(this);
    std::
    uninitialized_move<slang::ast::DistExpression::DistItem*,slang::ast::DistExpression::DistItem*>
              (__first,pDVar4,__result);
  }
  else {
    pDVar4 = begin(this);
    std::
    uninitialized_move<slang::ast::DistExpression::DistItem*,slang::ast::DistExpression::DistItem*>
              (pDVar4,pos,__result);
    pDVar4 = end(this);
    std::
    uninitialized_move<slang::ast::DistExpression::DistItem*,slang::ast::DistExpression::DistItem*>
              (pos,pDVar4,pDVar5 + 1);
  }
  cleanup(this,(EVP_PKEY_CTX *)pDVar4);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = __result;
  return pDVar5;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}